

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.h
# Opt level: O3

Sexp * NativeFunctionHelper<Sexp*,Sexp*,Sexp*,0ul,1ul>(long wrapped,undefined8 *args)

{
  Sexp *pSVar1;
  undefined8 local_18;
  undefined8 local_10;
  
  local_18 = *args;
  local_10 = args[1];
  if (*(long *)(wrapped + 0x10) != 0) {
    pSVar1 = (Sexp *)(**(code **)(wrapped + 0x18))(wrapped,&local_18,&local_10);
    return pSVar1;
  }
  std::__throw_bad_function_call();
}

Assistant:

Ret NativeFunctionHelper(std::function<Ret(Args...)> wrapped, Sexp **args,
                         std::index_sequence<Index...>) {
// both GCC and MSVC are silly and don't think that args is being used here,
// despite it obviously being used by the parameter pack below.
#if defined(__GNUG__) || defined(_MSC_VER)
  UNUSED_PARAMETER(args);
#endif
  return wrapped(args[Index]...);
}